

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_keymap_input(parser *p)

{
  byte *pbVar1;
  char *str;
  keypress trigger;
  prefs_data *d;
  keypress tmp [2];
  wchar_t mode;
  parser *p_local;
  
  pbVar1 = (byte *)parser_priv(p);
  if (pbVar1 != (byte *)0x0) {
    if ((*pbVar1 & 1) == 0) {
      tmp[1]._8_4_ = parser_getint(p,"mode");
      if (((int)tmp[1]._8_4_ < L'\0') || (L'\x01' < (int)tmp[1]._8_4_)) {
        p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
      }
      else {
        str = parser_getstr(p,"key");
        keypress_from_text((keypress *)&d,2,str);
        if (((int)d == 1) && (tmp[0].code == 0)) {
          trigger.code = d._4_4_;
          trigger.type = 1;
          trigger.mods = (undefined1)tmp[0].type;
          trigger._9_3_ = 0;
          keymap_add(tmp[1]._8_4_,trigger,(keypress *)(pbVar1 + 4),(_Bool)(pbVar1[0xf4] & 1));
          p_local._4_4_ = PARSE_ERROR_NONE;
        }
        else {
          p_local._4_4_ = PARSE_ERROR_FIELD_TOO_LONG;
        }
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-prefs.c"
                ,0x3d2,"enum parser_error parse_prefs_keymap_input(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_keymap_input(struct parser *p)
{
	int mode;
	struct keypress tmp[2];

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	mode = parser_getint(p, "mode");
	if (mode < 0 || mode >= KEYMAP_MODE_MAX)
		return PARSE_ERROR_OUT_OF_BOUNDS;

	keypress_from_text(tmp, N_ELEMENTS(tmp), parser_getstr(p, "key"));
	if (tmp[0].type != EVT_KBRD || tmp[1].type != EVT_NONE)
		return PARSE_ERROR_FIELD_TOO_LONG;

	keymap_add(mode, tmp[0], d->keymap_buffer, d->user);

	return PARSE_ERROR_NONE;
}